

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

_Bool Curl_ipv6works(Curl_easy *data)

{
  _Bool _Var1;
  uchar uVar2;
  int __fd;
  curl_socket_t s;
  int ipv6_works;
  _Bool works;
  Curl_easy *data_local;
  
  if (data == (Curl_easy *)0x0) {
    __fd = socket(10,2,0);
    data_local._7_1_ = __fd != -1;
    if (data_local._7_1_) {
      close(__fd);
    }
  }
  else {
    if (data->multi->ipv6_up == '\0') {
      _Var1 = Curl_ipv6works((Curl_easy *)0x0);
      uVar2 = '\x01';
      if (_Var1) {
        uVar2 = '\x02';
      }
      data->multi->ipv6_up = uVar2;
    }
    data_local._7_1_ = data->multi->ipv6_up == '\x02';
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_ipv6works(struct Curl_easy *data)
{
  if(data) {
    /* the nature of most system is that IPv6 status does not come and go
       during a program's lifetime so we only probe the first time and then we
       have the info kept for fast reuse */
    DEBUGASSERT(data);
    DEBUGASSERT(data->multi);
    if(data->multi->ipv6_up == IPV6_UNKNOWN) {
      bool works = Curl_ipv6works(NULL);
      data->multi->ipv6_up = works ? IPV6_WORKS : IPV6_DEAD;
    }
    return data->multi->ipv6_up == IPV6_WORKS;
  }
  else {
    int ipv6_works = -1;
    /* probe to see if we have a working IPv6 stack */
    curl_socket_t s = socket(PF_INET6, SOCK_DGRAM, 0);
    if(s == CURL_SOCKET_BAD)
      /* an IPv6 address was requested but we cannot get/use one */
      ipv6_works = 0;
    else {
      ipv6_works = 1;
      sclose(s);
    }
    return (ipv6_works > 0) ? TRUE : FALSE;
  }
}